

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void StartHTTPServer(void)

{
  int64_t iVar1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  int local_50;
  int rpcThreads;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-rpcthreads",(allocator<char> *)&local_50);
  iVar1 = ArgsManager::GetIntArg(&gArgs,&local_48,4);
  rpcThreads = 1;
  if (1 < iVar1) {
    rpcThreads = (int)iVar1;
  }
  std::__cxx11::string::~string((string *)&local_48);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httpserver.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "StartHTTPServer";
  logging_function._M_len = 0xf;
  LogPrintFormatInternal<int>
            (logging_function,source_file,500,ALL,Info,(ConstevalFormatString<1U>)0xc8df6b,
             &rpcThreads);
  std::thread::thread<void(&)(event_base*),event_base*&,void>
            ((thread *)&local_48,ThreadHTTP,&eventBase);
  std::thread::operator=(&g_thread_http,(thread *)&local_48);
  std::thread::~thread((thread *)&local_48);
  for (local_50 = 0; local_50 < rpcThreads; local_50 = local_50 + 1) {
    local_48._M_dataplus._M_p =
         (pointer)g_work_queue._M_t.
                  super___uniq_ptr_impl<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_WorkQueue<HTTPClosure>_*,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                  .super__Head_base<0UL,_WorkQueue<HTTPClosure>_*,_false>._M_head_impl;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(WorkQueue<HTTPClosure>*,int),WorkQueue<HTTPClosure>*,int&>
              ((vector<std::thread,std::allocator<std::thread>> *)&g_thread_http_workers,
               HTTPWorkQueueRun,(WorkQueue<HTTPClosure> **)&local_48,&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartHTTPServer()
{
    int rpcThreads = std::max((long)gArgs.GetIntArg("-rpcthreads", DEFAULT_HTTP_THREADS), 1L);
    LogInfo("Starting HTTP server with %d worker threads\n", rpcThreads);
    g_thread_http = std::thread(ThreadHTTP, eventBase);

    for (int i = 0; i < rpcThreads; i++) {
        g_thread_http_workers.emplace_back(HTTPWorkQueueRun, g_work_queue.get(), i);
    }
}